

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O2

void __thiscall Node::VariableScanOne(Node *this,int InDefineFlag)

{
  pointer pcVar1;
  size_type sVar2;
  VARTYPE VVar3;
  long lVar4;
  Node *pNVar5;
  VariableStruct *pVVar6;
  int iVar7;
  VARCLASS ThisClass;
  string *psVar8;
  Node *pNVar9;
  VariableStruct local_268;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  do {
    lVar4 = 0x28;
    iVar7 = this->Type;
    switch(iVar7) {
    case 0x1f8:
      GosubFlag = 1;
LAB_00107cfe:
      VariableScanOne(this->Tree[0],InDefineFlag);
      lVar4 = 0x30;
LAB_00107dbc:
      this = *(Node **)((long)this->Tree + lVar4 + -0x28);
      break;
    case 0x1f9:
      OnErrorFlag = 1;
LAB_00107d7f:
      this = this->Tree[0];
joined_r0x00107d6c:
      if (this == (Node *)0x0) {
        return;
      }
      break;
    case 0x1fa:
    case 0x1fb:
    case 0x1fc:
switchD_00107e84_caseD_123:
      if (this->Tree[0] != (Node *)0x0) {
        VariableScan(this->Tree[0],InDefineFlag);
      }
      if (this->Tree[1] != (Node *)0x0) {
        VariableScan(this->Tree[1],InDefineFlag);
      }
      if (this->Tree[2] != (Node *)0x0) {
        VariableScan(this->Tree[2],InDefineFlag);
      }
      if (this->Tree[3] != (Node *)0x0) {
        VariableScan(this->Tree[3],InDefineFlag);
      }
      if (this->Tree[4] != (Node *)0x0) {
        VariableScan(this->Tree[4],InDefineFlag);
      }
      if (this->Block[1] != (Node *)0x0) {
        VariableScan(this->Block[1],InDefineFlag);
      }
      if (this->Block[2] == (Node *)0x0) {
        return;
      }
      VariableScan(this->Block[2],InDefineFlag);
      return;
    case 0x1fd:
    case 0x1fe:
switchD_00107d21_caseD_1db:
      pNVar9 = this->Tree[0];
      VVar3 = VARTYPE_REAL;
      ThisClass = VARCLASS_FUNC;
      iVar7 = 1;
      goto LAB_001081bc;
    case 0x1ff:
      goto switchD_00107e84_caseD_124;
    default:
      switch(iVar7) {
      case 0x1cd:
        pVVar6 = VariableList::Lookup(Variables,&this->TextValue,this,0);
        if (pVVar6 == (VariableStruct *)0x0) {
          std::__cxx11::string::string((string *)&local_50,(string *)&this->TextValue);
          VariableStruct::VariableStruct
                    (&local_268,&local_50,VARTYPE_VOID,VARCLASS_FUNC,InDefineFlag,0);
          std::__cxx11::string::~string((string *)&local_50);
          VariableList::Append(Variables,&local_268,1);
          VariableStruct::~VariableStruct(&local_268);
        }
        else {
          pVVar6->Class = VARCLASS_FUNC;
        }
        if (this->Tree[0] != (Node *)0x0) {
          VariableScan(this->Tree[0],InDefineFlag);
        }
LAB_0010855b:
        pNVar9 = this->Tree[3];
LAB_00108651:
        if (pNVar9 == (Node *)0x0) {
          return;
        }
        InDefineFlag = 1;
        goto LAB_00108659;
      case 0x1ce:
      case 0x1cf:
      case 0x1d0:
        return;
      case 0x1d1:
        psVar8 = &this->TextValue;
        pcVar1 = (this->TextValue)._M_dataplus._M_p;
        sVar2 = (this->TextValue)._M_string_length;
        if (pcVar1[sVar2 - 1] == ':') {
          std::__cxx11::string::erase(psVar8,pcVar1 + (sVar2 - 1));
        }
        pVVar6 = VariableList::Lookup(Variables,psVar8,(Node *)0x0,0);
        if (pVVar6 != (VariableStruct *)0x0) {
          return;
        }
        std::__cxx11::string::string((string *)&local_b0,(string *)psVar8);
        VariableStruct::VariableStruct(&local_268,&local_b0,VARTYPE_LABEL,VARCLASS_LABEL,1,0);
        std::__cxx11::string::~string((string *)&local_b0);
        VariableList::Append(Variables,&local_268,0);
        break;
      case 0x1d2:
        pVVar6 = VariableList::Lookup(Variables,&this->TextValue,(Node *)0x0,0);
        if (pVVar6 != (VariableStruct *)0x0) {
          pVVar6->EverUsed = pVVar6->EverUsed + 1;
          return;
        }
        std::__cxx11::string::string((string *)&local_d0,(string *)&this->TextValue);
        VariableStruct::VariableStruct(&local_268,&local_d0,VARTYPE_LABEL,VARCLASS_LABEL,1,0);
        std::__cxx11::string::~string((string *)&local_d0);
        local_268.EverUsed = local_268.EverUsed + 1;
        VariableList::Append(Variables,&local_268,0);
        break;
      case 0x1d3:
        VariableList::Define(Variables,this,0,InDefineFlag);
        if (this->Tree[0] != (Node *)0x0) {
          VariableScanOne(this->Tree[0],InDefineFlag);
        }
        this = this->Tree[2];
        goto joined_r0x00107d6c;
      case 0x1d4:
      case 0x1d5:
      case 0x1d6:
      case 0x1d7:
      case 0x1d8:
      case 0x1d9:
        goto switchD_00107e84_caseD_123;
      case 0x1db:
        goto switchD_00107d21_caseD_1db;
      default:
        if (iVar7 == 0x14b) {
          GosubFlag = 1;
          goto LAB_00107dbc;
        }
        if (iVar7 == 0x1ef) goto LAB_00107cfe;
        if (iVar7 == 0x207) {
          LowerCase(&this->TextValue);
          if (this->Tree[0] != (Node *)0x0) {
            VariableScanOne(this->Tree[0],InDefineFlag);
          }
          this = this->Tree[2];
          goto joined_r0x00107d6c;
        }
        if (iVar7 == 0x209) {
          WhenErrorFlag = 1;
          goto LAB_00107d7f;
        }
        switch(iVar7) {
        case 0x122:
        case 0x125:
        case 0x126:
          return;
        case 0x123:
        case 0x127:
        case 0x128:
        case 0x129:
        case 0x12a:
          goto switchD_00107e84_caseD_123;
        case 0x124:
          break;
        case 299:
          if (this->Tree[1] != (Node *)0x0) {
            VariableScanOne(this->Tree[1],1);
          }
          break;
        default:
          if (iVar7 == 0x2b) {
            VariableScanOne(this->Tree[0],InDefineFlag);
            VariableScanOne(this->Tree[1],InDefineFlag);
            iVar7 = IsReallyString(this->Tree[0]);
            if (iVar7 == 0) {
              return;
            }
            iVar7 = IsReallyString(this->Tree[1]);
            if (iVar7 == 0) {
              return;
            }
            std::operator+(&local_268.BasicName,&this->Tree[0]->TextValue,&this->Tree[1]->TextValue)
            ;
            this->Type = 0x1d4;
            pNVar9 = this->Tree[0];
            if (pNVar9 != (Node *)0x0) {
              ~Node(pNVar9);
            }
            operator_delete(pNVar9,0x70);
            this->Tree[0] = (Node *)0x0;
            pNVar9 = this->Tree[1];
            if (pNVar9 != (Node *)0x0) {
              ~Node(pNVar9);
            }
            operator_delete(pNVar9,0x70);
            this->Tree[1] = (Node *)0x0;
            std::__cxx11::string::_M_assign((string *)&this->TextValue);
            std::__cxx11::string::~string((string *)&local_268);
            return;
          }
          if (iVar7 == 0x111) {
            pNVar9 = this->Tree[0];
            VVar3 = VARTYPE_VOID;
            ThisClass = VARCLASS_FUNC;
            iVar7 = 0;
            goto LAB_001081bc;
          }
          if (iVar7 == 0x115) {
            if ((this->Tree[1]->Type == 0x1d3) &&
               ((pVVar6 = VariableList::Lookup(Variables,&this->Tree[1]->TextValue,(Node *)0x0,0),
                pVVar6 == (VariableStruct *)0x0 || (pVVar6->Type != VARTYPE_DYNSTR)))) {
              std::__cxx11::string::string((string *)&local_f0,(string *)&this->Tree[0]->TextValue);
              VVar3 = GuessVarType(&local_f0);
              std::__cxx11::string::~string((string *)&local_f0);
              if (VVar3 == VARTYPE_DYNSTR) goto LAB_00108238;
              this->Type = 0x116;
              pNVar9 = this->Tree[1];
              pNVar5 = (Node *)operator_new(0x70);
              std::__cxx11::string::string((string *)&local_130,"",(allocator *)&local_268);
              Node(pNVar5,0x203,&local_130,0,0);
              Link(pNVar9,pNVar5,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
              psVar8 = &local_130;
            }
            else {
LAB_00108238:
              this->Type = 0x117;
              pNVar9 = this->Tree[0];
              pNVar5 = (Node *)operator_new(0x70);
              std::__cxx11::string::string((string *)&local_110,"",(allocator *)&local_268);
              Node(pNVar5,0x203,&local_110,0,0);
              Link(pNVar9,pNVar5,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
              psVar8 = &local_110;
            }
            std::__cxx11::string::~string((string *)psVar8);
            VariableScan(this->Tree[0],InDefineFlag);
          }
          else {
            if (iVar7 == 0x11b) {
LAB_00107eba:
              ScanMap(this);
              return;
            }
            if (iVar7 == 0x137) break;
            if (iVar7 == 0x143) {
LAB_00107e59:
              if (this->Tree[0] == (Node *)0x0) {
                VVar3 = VARTYPE_VOID;
              }
              else {
                VVar3 = ScanType(this->Tree[0]);
              }
              pVVar6 = VariableList::Lookup(Variables,&this->Tree[1]->TextValue,this,0);
              if (pVVar6 == (VariableStruct *)0x0) {
                std::__cxx11::string::string
                          ((string *)&local_70,(string *)&this->Tree[1]->TextValue);
                VariableStruct::VariableStruct
                          (&local_268,&local_70,VVar3,VARCLASS_FUNC,InDefineFlag,0);
                std::__cxx11::string::~string((string *)&local_70);
                VariableList::Append(Variables,&local_268,1);
                VariableStruct::~VariableStruct(&local_268);
              }
              else {
                pVVar6->Class = VARCLASS_FUNC;
                pVVar6->Type = VVar3;
              }
              goto LAB_0010855b;
            }
            if (iVar7 == 0x144) {
              if (this->Tree[0] == (Node *)0x0) {
                VVar3 = VARTYPE_VOID;
              }
              else {
                VVar3 = ScanType(this->Tree[0]);
              }
              pVVar6 = VariableList::Lookup(Variables,&this->Tree[2]->TextValue,this,0);
              if (pVVar6 == (VariableStruct *)0x0) {
                std::__cxx11::string::string
                          ((string *)&local_90,(string *)&this->Tree[2]->TextValue);
                VariableStruct::VariableStruct
                          (&local_268,&local_90,VVar3,VARCLASS_FUNC,InDefineFlag,0);
                std::__cxx11::string::~string((string *)&local_90);
                VariableList::Append(Variables,&local_268,1);
                VariableStruct::~VariableStruct(&local_268);
              }
              else {
                pVVar6->Class = VARCLASS_FUNC;
                pVVar6->Type = VVar3;
              }
              pNVar9 = this->Tree[2]->Tree[0];
              goto LAB_00108651;
            }
            if (iVar7 == 0x161) goto LAB_00107eba;
            if (iVar7 != 0x163) {
              if (iVar7 == 0x183) {
                return;
              }
              if (iVar7 == 0x18d) {
                if (this->Tree[0] != (Node *)0x0) {
                  VariableScanOne(this->Tree[0],InDefineFlag);
                }
                OnErrorFlag = 1;
                WhenErrorFlag = 1;
                return;
              }
              if (iVar7 == 399) {
                GosubFlag = 1;
                return;
              }
              if (iVar7 != 0x1a1) goto switchD_00107e84_caseD_123;
              goto LAB_00107e59;
            }
            pNVar9 = this->Tree[0];
            pNVar5 = (Node *)operator_new(0x70);
            std::__cxx11::string::string((string *)&local_150,"",(allocator *)&local_268);
            Node(pNVar5,0x203,&local_150,0,0);
            Link(pNVar9,pNVar5,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
            std::__cxx11::string::~string((string *)&local_150);
            VariableScan(this->Tree[0],InDefineFlag);
            pNVar9 = this->Tree[1];
            iVar7 = pNVar9->Type;
            if (1 < iVar7 - 0x2aU) {
              if (iVar7 == 0x28) {
                pNVar9 = pNVar9->Tree[1];
                pNVar5 = (Node *)operator_new(0x70);
                std::__cxx11::string::string((string *)&local_1d0,"",(allocator *)&local_268);
                Node(pNVar5,0x203,&local_1d0,0,0);
                Link(pNVar9,pNVar5,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
                std::__cxx11::string::~string((string *)&local_1d0);
                VariableScan(this->Tree[1]->Tree[0],InDefineFlag);
                pNVar9 = this->Tree[1]->Tree[1];
                goto LAB_00108659;
              }
              if (iVar7 != 0x2d) {
                if ((iVar7 != 0x154) && (iVar7 != 0x1a8)) {
                  return;
                }
                pNVar9 = pNVar9->Tree[0];
                pNVar5 = (Node *)operator_new(0x70);
                std::__cxx11::string::string((string *)&local_170,"",(allocator *)&local_268);
                Node(pNVar5,0x203,&local_170,0,0);
                Link(pNVar9,pNVar5,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
                std::__cxx11::string::~string((string *)&local_170);
                pNVar9 = this->Tree[1];
                goto LAB_00108659;
              }
            }
            pNVar9 = pNVar9->Tree[0];
            pNVar5 = (Node *)operator_new(0x70);
            std::__cxx11::string::string((string *)&local_190,"",(allocator *)&local_268);
            Node(pNVar5,0x203,&local_190,0,0);
            Link(pNVar9,pNVar5,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
            std::__cxx11::string::~string((string *)&local_190);
            pNVar9 = this->Tree[1]->Tree[1];
            pNVar5 = (Node *)operator_new(0x70);
            std::__cxx11::string::string((string *)&local_1b0,"",(allocator *)&local_268);
            Node(pNVar5,0x203,&local_1b0,0,0);
            Link(pNVar9,pNVar5,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
            std::__cxx11::string::~string((string *)&local_1b0);
          }
          pNVar9 = this->Tree[1];
LAB_00108659:
          VariableScan(pNVar9,InDefineFlag);
          return;
        }
      case 0x1da:
switchD_00107e84_caseD_124:
        pNVar9 = this->Tree[0];
        VVar3 = VARTYPE_REAL;
        iVar7 = 1;
        ThisClass = VARCLASS_NONE;
LAB_001081bc:
        ScanVarList(pNVar9,VVar3,ThisClass,iVar7);
        return;
      }
      VariableStruct::~VariableStruct(&local_268);
      return;
    }
  } while( true );
}

Assistant:

void Node::VariableScanOne(
	int InDefineFlag	/**< Are we in a define statement */
)
{
	VariableStruct *ThisVar;
	VARTYPE ThisType = VARTYPE_NONE;

	//
	// Look at current node type
	//
	switch (Type)
	{
	case BAS_N_EXTERNALCONSTANT:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_NONE, true);
		break;

	case BAS_N_EXTERNALSUB:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_FUNC, true);
		break;

	case BAS_S_CALL:
		Tree[0]->ScanVarList(VARTYPE_VOID, VARCLASS_FUNC, false);
		break;

	case BAS_S_COMMON:
		ScanMap();
		break;

	case BAS_S_DATA:
		break;

	case BAS_S_DECLARE:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_NONE, true);
		break;

	case BAS_V_DECLARECONSTANT:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_NONE, true);
		break;

	case BAS_V_DECLAREFUN:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_FUNC, true);
		break;

	case BAS_S_DIM:
		if (Tree[1] != 0)
		{
			Tree[1]->VariableScanOne(1);
		}
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_NONE, true);
		break;

	case BAS_S_EXTERNAL:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_NONE, true);
		break;

	case BAS_S_MAP:
		ScanMap();
		break;

	case BAS_V_FUNCTION:
		//
		// Built in function
		//
		ThisVar = Variables->Lookup(TextValue, this);
		if (ThisVar == 0)
		{
			//
			// Create variable
			//
			VariableStruct NewVar(TextValue,
				VARTYPE_VOID, VARCLASS_FUNC, InDefineFlag);

			//
			// Add to variable table
			//
			Variables->Append(NewVar, true);	// Forced global
		}
		else
		{
			ThisVar->Class = VARCLASS_FUNC;
		}
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScan(InDefineFlag);
		}
		if (Tree[3] != 0)
		{
			Tree[3]->VariableScan(1);
		}
		break;

	case BAS_N_EXTERNALFUNCTION:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_FUNC, true);
		break;

	case BAS_S_DEF:
	case BAS_S_DEFSTAR:
		break;

	case BAS_S_FUNCTION:
	case BAS_S_SUB:

		//
		// Function Definition
		//   0 = Return type
		//   1 - Function name
		//   2 -
		//   3 - Calling Parameters
		//
		// must have a name
		//
		//
		// Functions return type
		//
		if (Tree[0] != 0)
		{
			ThisType = Tree[0]->ScanType();
		}
		else
		{
			ThisType = VARTYPE_VOID;
		}

		//
		// This functions name
		//
		ThisVar = Variables->Lookup(Tree[1]->TextValue, this);
		if (ThisVar == 0)
		{
			//
			// Create variable
			//
			VariableStruct NewVar(Tree[1]->TextValue,
				ThisType, VARCLASS_FUNC, InDefineFlag);

			//
			// Add to variable table
			//
			Variables->Append(NewVar, true);	// Forced global
		}
		else
		{
			ThisVar->Class =VARCLASS_FUNC;
			ThisVar->Type = ThisType;
		}

		//
		// Scan calling parameters
		//
		if (Tree[3] != 0)
		{
			Tree[3]->VariableScan(1);
		}

		break;

	case BAS_S_MAINFUNCTION:
		//
		// Function Definition
		//
		if (Tree[0] != 0)
		{
			ThisType = Tree[0]->ScanType();
		}
		else
		{
			ThisType = VARTYPE_VOID;
		}

		ThisVar = Variables->Lookup(Tree[2]->TextValue, this);
		if (ThisVar == 0)
		{
			//
			// Create variable
			//
			VariableStruct NewVar(Tree[2]->TextValue,
				ThisType, VARCLASS_FUNC, InDefineFlag);

			//
			// Add to variable table
			//
			Variables->Append(NewVar, 1);		// Forced global
		}
		else
		{
			ThisVar->Class = VARCLASS_FUNC;
			ThisVar->Type = ThisType;
		}

		//
		// Scan calling parameters
		//
		if (Tree[2]->Tree[0] != 0)
		{
			Tree[2]->Tree[0]->VariableScan(1);
		}

		break;

	case BAS_V_LABEL:
		if (*(TextValue.end() - 1) == ':')
		{
#ifdef STLREMOVE
			TextValue.remove(TextValue.end() - 1);
#else
			TextValue.erase(TextValue.end() - 1);
#endif
		}
		ThisVar = Variables->Lookup(TextValue, 0);
		if (ThisVar == 0)
		{
			VariableStruct NewVar(TextValue,
				VARTYPE_LABEL, VARCLASS_LABEL, true);
			Variables->Append(NewVar);
		}
		break;

	case BAS_V_USELABEL:
		ThisVar = Variables->Lookup(TextValue, 0);
		if (ThisVar == 0)
		{
			VariableStruct NewVar(TextValue,
				VARTYPE_LABEL, VARCLASS_LABEL, true);
			NewVar.EverUsed++;
			Variables->Append(NewVar);
		}
		else
		{
			ThisVar->EverUsed++;
		}
		break;

	case BAS_V_NAME:
		Variables->Define(this, false, InDefineFlag);

		//
		// Look at possible array reference
		//
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScanOne(InDefineFlag);
		}

		if (Tree[2] != 0)
		{
			Tree[2]->VariableScanOne(InDefineFlag);
		}

		break;

	case BAS_S_RECORD:
//
// FIXME:
// We don't scan the structure names because they are not real
// (ie. expposed to the outside world).
// We should probibly create some kind of definition list for structure
// definitions.
//
//		Tree[0]->VariableScanOne(1);
		break;

	case BAS_N_STRUCTNAME:

		//
		// Force structure variable to be usable under C++
		//
		LowerCase(TextValue);

		//
		// Look at possible array reference
		//
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScanOne(InDefineFlag);
		}

		if (Tree[2] != 0)
		{
			Tree[2]->VariableScanOne(InDefineFlag);
		}

		break;

	case BAS_X_STRREF:

		Tree[0]->VariableScanOne(InDefineFlag);
		Tree[1]->VariableScanOne(InDefineFlag);

		break;

	case BAS_S_GOSUB:
		GosubFlag = 1;
		Tree[0]->VariableScanOne(InDefineFlag);
		break;

	case BAS_N_ONERROR:
		OnErrorFlag = 1;
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScanOne(InDefineFlag);
		}
		break;

	case BAS_N_WHENERRORIN:
		WhenErrorFlag = 1;
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScanOne(InDefineFlag);
		}
		break;

	case BAS_N_ONGOSUB:
		GosubFlag = 1;
		Tree[0]->VariableScanOne(InDefineFlag);
		Tree[1]->VariableScanOne(InDefineFlag);
		break;

	case BAS_S_RETURN:
		GosubFlag = 1;
		break;

	case BAS_S_RESUME:
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScanOne(InDefineFlag);
		}
		OnErrorFlag = 1;
		WhenErrorFlag = 1;
		break;

	case '+':
		//
		// Process lower levels first
		//
		Tree[0]->VariableScanOne(InDefineFlag);
		Tree[1]->VariableScanOne(InDefineFlag);

		//
		// Let's try and merge text strings together
		//
		if (Tree[0]->IsReallyString() && Tree[1]->IsReallyString())
		{
			//
			// Create merged string (Using the colon
			// concatination options)
			//
			std::string Merger = Tree[0]->TextValue + Tree[1]->TextValue;

			//
			// Change the root node to the concatinated string
			// type.
			//
			Type = BAS_V_TEXTSTRING;
			delete Tree[0];
			Tree[0] = 0;
			delete Tree[1];
			Tree[1] = 0;
			TextValue = Merger;
		}
		break;

	case BAS_S_CHANGE:
		//
		// This is a strange statement, and we need to determine
		// which one is a string and which one is a numeric
		// array.
		//
		{
			//
			// Assume 2nd one is a string
			//
			VARTYPE Type1 = VARTYPE_DYNSTR;
			if (Tree[1]->Type != BAS_V_NAME)
			{
				//
				// If it isn't a variable name, it better be
				// a string. (You can't add arrays)
				//
				Type1 = VARTYPE_DYNSTR;
			}
			else
			{
				//
				// Does it already have a defined type?
				//
				ThisVar = Variables->Lookup(Tree[1]->TextValue, 0);
				if ((ThisVar != 0) &&
					(ThisVar->Type == VARTYPE_DYNSTR))
				{
					Type1 = ThisVar->Type;
				}
				else
				{
					Type1 = GuessVarType(Tree[0]->TextValue);
				}
			}
			//
			// Ok, now force one of them to be an array
			//
			if (Type1 == VARTYPE_DYNSTR)
			{
				// change a% to b$
				Type = BAS_S_CHANGE2;
				Tree[0]->Link(new Node(BAS_N_NULL));
			}
			else
			{
				// change a$ to b%
				Type = BAS_S_CHANGE1;
				Tree[1]->Link(new Node(BAS_N_NULL));
			}
		}
		Tree[0]->VariableScan(InDefineFlag);
		Tree[1]->VariableScan(InDefineFlag);
		break;

	case BAS_S_MAT:
		//
		// Force array type to l-value
		//
		Tree[0]->Link(new Node(BAS_N_NULL));
		Tree[0]->VariableScan(InDefineFlag);

		switch(Tree[1]->Type)
		{
		case BAS_S_CON:		// MAT xxx = ZER
		case BAS_S_IDN:
		case BAS_S_ZER:
			break;

		case BAS_S_TRN:		// MAT xxx = TRN(yyy)
		case BAS_S_INV:
			//
			// rvalue MUST be array
			//
			Tree[1]->Tree[0]->Link(new Node(BAS_N_NULL));
			Tree[1]->VariableScan(InDefineFlag);
			break;

		case '+':			// MAT xxx = yyy + zzz
		case '-':
		case '*':
			//
			// Two rvalues MUST be arrays
			//
			Tree[1]->Tree[0]->Link(new Node(BAS_N_NULL));
			Tree[1]->Tree[1]->Link(new Node(BAS_N_NULL));
			Tree[1]->VariableScan(InDefineFlag);
			break;

		case '(':			// MAT xxx = (yyy) * zzz
			//
			// right rvalue values MUST be arrays
			//
			Tree[1]->Tree[1]->Link(new Node(BAS_N_NULL));
			Tree[1]->Tree[0]->VariableScan(InDefineFlag);
			Tree[1]->Tree[1]->VariableScan(InDefineFlag);
			break;

		default:			// Oops, forgot to code something
			break;
		}

		break;

	case BAS_V_INTEGER:
	case BAS_V_FLOAT:
	case BAS_V_INT:
		// Ignore various numeric constants
		break;

	default:
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScan(InDefineFlag);
		}

		if (Tree[1] != 0)
		{
			Tree[1]->VariableScan(InDefineFlag);
		}

		if (Tree[2] != 0)
		{
			Tree[2]->VariableScan(InDefineFlag);
		}

		if (Tree[3] != 0)
		{
			Tree[3]->VariableScan(InDefineFlag);
		}

		if (Tree[4] != 0)
		{
			Tree[4]->VariableScan(InDefineFlag);
		}

		if (Block[1] != 0)
		{
			Block[1]->VariableScan(InDefineFlag);
		}

		if (Block[2] != 0)
		{
			Block[2]->VariableScan(InDefineFlag);
		}
		break;
	}
}